

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O2

int mbedtls_net_recv(void *ctx,uchar *buf,size_t len)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  
  if (*ctx < 0) {
    iVar1 = -0x45;
  }
  else {
    sVar3 = read(*ctx,buf,len);
    iVar1 = (int)sVar3;
    if (iVar1 < 0) {
      iVar2 = net_would_block((mbedtls_net_context *)ctx);
      iVar1 = -0x6900;
      if (iVar2 == 0) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        iVar1 = -0x50;
        if ((iVar2 != 0x68) && (iVar2 != 0x20)) {
          if (iVar2 == 4) {
            iVar1 = -0x6900;
          }
          else {
            iVar1 = -0x4c;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_net_recv(void *ctx, unsigned char *buf, size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    ret = check_fd(fd, 0);
    if (ret != 0) {
        return ret;
    }

    ret = (int) read(fd, buf, len);

    if (ret < 0) {
        if (net_would_block(ctx) != 0) {
            return MBEDTLS_ERR_SSL_WANT_READ;
        }

#if (defined(_WIN32) || defined(_WIN32_WCE)) && !defined(EFIX64) && \
        !defined(EFI32)
        if (WSAGetLastError() == WSAECONNRESET) {
            return MBEDTLS_ERR_NET_CONN_RESET;
        }
#else
        if (errno == EPIPE || errno == ECONNRESET) {
            return MBEDTLS_ERR_NET_CONN_RESET;
        }

        if (errno == EINTR) {
            return MBEDTLS_ERR_SSL_WANT_READ;
        }
#endif

        return MBEDTLS_ERR_NET_RECV_FAILED;
    }

    return ret;
}